

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O2

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkey
          (Privkey *__return_storage_ptr__,KeyApi *this,string *privkey,NetType *net_type,
          bool *is_compressed)

{
  bool bVar1;
  bool is_compress;
  NetType temp_net_type;
  Privkey local_40;
  
  core::Privkey::Privkey(__return_storage_ptr__);
  is_compress = true;
  temp_net_type = kMainnet;
  bVar1 = core::Privkey::HasWif(privkey,&temp_net_type,&is_compress);
  if (bVar1) {
    core::Privkey::FromWif(&local_40,privkey,temp_net_type,is_compress);
    core::Privkey::operator=(__return_storage_ptr__,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
    if (net_type != (NetType *)0x0) {
      *net_type = temp_net_type;
    }
    if (is_compressed != (bool *)0x0) {
      *is_compressed = is_compress;
    }
  }
  else {
    core::Privkey::Privkey(&local_40,privkey,kMainnet,true);
    core::Privkey::operator=(__return_storage_ptr__,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey KeyApi::GetPrivkey(
    const std::string& privkey, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(privkey, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  } else {
    key = Privkey(privkey);
  }
  return key;
}